

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompress(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_customMem customMem;
  ZSTD_DCtx *dctx;
  ZSTD_DDict *ddict;
  size_t sVar1;
  undefined8 unaff_RBX;
  void *unaff_R12;
  undefined8 in_stack_ffffffffffffffd0;
  
  customMem.customFree = (ZSTD_freeFunction)unaff_RBX;
  customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
  customMem.opaque = unaff_R12;
  dctx = ZSTD_createDCtx_internal(customMem);
  if (dctx == (ZSTD_DCtx *)0x0) {
    sVar1 = 0xffffffffffffffc0;
  }
  else {
    ddict = ZSTD_getDDict(dctx);
    sVar1 = ZSTD_decompressMultiFrame(dctx,dst,dstCapacity,src,srcSize,(void *)0x0,0,ddict);
    ZSTD_freeDCtx(dctx);
  }
  return sVar1;
}

Assistant:

size_t ZSTD_decompress(void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
#if defined(ZSTD_HEAPMODE) && (ZSTD_HEAPMODE>=1)
    size_t regenSize;
    ZSTD_DCtx* const dctx =  ZSTD_createDCtx_internal(ZSTD_defaultCMem);
    RETURN_ERROR_IF(dctx==NULL, memory_allocation, "NULL pointer!");
    regenSize = ZSTD_decompressDCtx(dctx, dst, dstCapacity, src, srcSize);
    ZSTD_freeDCtx(dctx);
    return regenSize;
#else   /* stack mode */
    ZSTD_DCtx dctx;
    ZSTD_initDCtx_internal(&dctx);
    return ZSTD_decompressDCtx(&dctx, dst, dstCapacity, src, srcSize);
#endif
}